

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseGetLasts(xmlParserCtxtPtr ctxt,xmlChar **lastlt,xmlChar **lastgt)

{
  xmlGenericErrorFunc p_Var1;
  xmlChar *pxVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  bool bVar5;
  xmlChar *local_28;
  xmlChar *tmp;
  xmlChar **lastgt_local;
  xmlChar **lastlt_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (((ctxt == (xmlParserCtxtPtr)0x0) || (lastlt == (xmlChar **)0x0)) ||
     (lastgt == (xmlChar **)0x0)) {
    pp_Var3 = __xmlGenericError();
    p_Var1 = *pp_Var3;
    ppvVar4 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar4,"Internal error: xmlParseGetLasts\n");
  }
  else if ((ctxt->progressive == 0) || (ctxt->inputNr != 1)) {
    *lastlt = (xmlChar *)0x0;
    *lastgt = (xmlChar *)0x0;
  }
  else {
    local_28 = ctxt->input->end;
    do {
      pxVar2 = local_28;
      local_28 = pxVar2 + -1;
      bVar5 = false;
      if (ctxt->input->base <= local_28) {
        bVar5 = *local_28 != '<';
      }
    } while (bVar5);
    if (local_28 < ctxt->input->base) {
      *lastlt = (xmlChar *)0x0;
      *lastgt = (xmlChar *)0x0;
    }
    else {
      *lastlt = local_28;
      local_28 = pxVar2;
      while( true ) {
        bVar5 = false;
        if (local_28 < ctxt->input->end) {
          bVar5 = *local_28 != '>';
        }
        if (!bVar5) break;
        if (*local_28 == '\'') {
          do {
            pxVar2 = local_28;
            local_28 = pxVar2 + 1;
            bVar5 = false;
            if (local_28 < ctxt->input->end) {
              bVar5 = *local_28 != '\'';
            }
          } while (bVar5);
          if (local_28 < ctxt->input->end) {
            local_28 = pxVar2 + 2;
          }
        }
        else if (*local_28 == '\"') {
          do {
            pxVar2 = local_28;
            local_28 = pxVar2 + 1;
            bVar5 = false;
            if (local_28 < ctxt->input->end) {
              bVar5 = *local_28 != '\"';
            }
          } while (bVar5);
          if (local_28 < ctxt->input->end) {
            local_28 = pxVar2 + 2;
          }
        }
        else {
          local_28 = local_28 + 1;
        }
      }
      if (local_28 < ctxt->input->end) {
        *lastgt = local_28;
      }
      else {
        local_28 = *lastlt;
        do {
          local_28 = local_28 + -1;
          bVar5 = false;
          if (ctxt->input->base <= local_28) {
            bVar5 = *local_28 != '>';
          }
        } while (bVar5);
        if (local_28 < ctxt->input->base) {
          *lastgt = (xmlChar *)0x0;
        }
        else {
          *lastgt = local_28;
        }
      }
    }
  }
  return;
}

Assistant:

static void
xmlParseGetLasts(xmlParserCtxtPtr ctxt, const xmlChar **lastlt,
                 const xmlChar **lastgt) {
    const xmlChar *tmp;

    if ((ctxt == NULL) || (lastlt == NULL) || (lastgt == NULL)) {
	xmlGenericError(xmlGenericErrorContext,
		    "Internal error: xmlParseGetLasts\n");
	return;
    }
    if ((ctxt->progressive != 0) && (ctxt->inputNr == 1)) {
        tmp = ctxt->input->end;
	tmp--;
	while ((tmp >= ctxt->input->base) && (*tmp != '<')) tmp--;
	if (tmp < ctxt->input->base) {
	    *lastlt = NULL;
	    *lastgt = NULL;
	} else {
	    *lastlt = tmp;
	    tmp++;
	    while ((tmp < ctxt->input->end) && (*tmp != '>')) {
	        if (*tmp == '\'') {
		    tmp++;
		    while ((tmp < ctxt->input->end) && (*tmp != '\'')) tmp++;
		    if (tmp < ctxt->input->end) tmp++;
		} else if (*tmp == '"') {
		    tmp++;
		    while ((tmp < ctxt->input->end) && (*tmp != '"')) tmp++;
		    if (tmp < ctxt->input->end) tmp++;
		} else
		    tmp++;
	    }
	    if (tmp < ctxt->input->end)
	        *lastgt = tmp;
	    else {
	        tmp = *lastlt;
		tmp--;
		while ((tmp >= ctxt->input->base) && (*tmp != '>')) tmp--;
		if (tmp >= ctxt->input->base)
		    *lastgt = tmp;
		else
		    *lastgt = NULL;
	    }
	}
    } else {
        *lastlt = NULL;
	*lastgt = NULL;
    }
}